

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O2

ggml_tensor *
map_tensor(map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
           *tensor_map,ggml_context *ctx,ggml_tensor *tensor)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  iterator iVar8;
  mapped_type *ppgVar9;
  mapped_type pgVar10;
  long lVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *tensor_local;
  
  if (tensor == (ggml_tensor *)0x0) {
    pgVar10 = (mapped_type)0x0;
  }
  else {
    tensor_local = tensor;
    iVar8 = std::
            _Rb_tree<ggml_tensor_*,_std::pair<ggml_tensor_*const,_ggml_tensor_*>,_std::_Select1st<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
            ::find(&tensor_map->_M_t,&tensor_local);
    if ((_Rb_tree_header *)iVar8._M_node == &(tensor_map->_M_t)._M_impl.super__Rb_tree_header) {
      pgVar10 = ggml_dup_tensor(ctx,tensor_local);
      ppgVar9 = std::
                map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                ::operator[](tensor_map,&tensor_local);
      pgVar12 = tensor_local;
      *ppgVar9 = pgVar10;
      pgVar10->op = tensor_local->op;
      for (lVar11 = 6; lVar11 != 10; lVar11 = lVar11 + 1) {
        pgVar10->ne[lVar11 + -2] = tensor_local->ne[lVar11 + -2];
      }
      pgVar10->flags = tensor_local->flags;
      uVar1 = *(undefined8 *)(tensor_local->op_params + 2);
      uVar2 = *(undefined8 *)(tensor_local->op_params + 4);
      uVar3 = *(undefined8 *)(tensor_local->op_params + 6);
      uVar4 = *(undefined8 *)(tensor_local->op_params + 8);
      uVar5 = *(undefined8 *)(tensor_local->op_params + 10);
      uVar6 = *(undefined8 *)(tensor_local->op_params + 0xc);
      uVar7 = *(undefined8 *)(tensor_local->op_params + 0xe);
      *(undefined8 *)pgVar10->op_params = *(undefined8 *)tensor_local->op_params;
      *(undefined8 *)(pgVar10->op_params + 2) = uVar1;
      *(undefined8 *)(pgVar10->op_params + 4) = uVar2;
      *(undefined8 *)(pgVar10->op_params + 6) = uVar3;
      *(undefined8 *)(pgVar10->op_params + 8) = uVar4;
      *(undefined8 *)(pgVar10->op_params + 10) = uVar5;
      *(undefined8 *)(pgVar10->op_params + 0xc) = uVar6;
      *(undefined8 *)(pgVar10->op_params + 0xe) = uVar7;
      strcpy(pgVar10->name,tensor_local->name);
      pgVar10->data = pgVar12->data;
      pgVar10->buffer = pgVar12->buffer;
      pgVar10->extra = pgVar12->extra;
      pgVar10->view_offs = pgVar12->view_offs;
      pgVar12 = map_tensor(tensor_map,ctx,pgVar12->view_src);
      pgVar10->view_src = pgVar12;
      for (lVar11 = 0x13; lVar11 != 0x1d; lVar11 = lVar11 + 1) {
        pgVar12 = map_tensor(tensor_map,ctx,(ggml_tensor *)tensor_local->ne[lVar11 + -2]);
        pgVar10->ne[lVar11 + -2] = (int64_t)pgVar12;
      }
    }
    else {
      ppgVar9 = std::
                map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                ::operator[](tensor_map,&tensor_local);
      pgVar10 = *ppgVar9;
    }
  }
  return pgVar10;
}

Assistant:

static ggml_tensor * map_tensor(std::map<ggml_tensor *, ggml_tensor *> & tensor_map, ggml_context * ctx, ggml_tensor * tensor) {
    if (!tensor) {
        return nullptr;
    }

    if (tensor_map.find(tensor) != tensor_map.end()) {
        return tensor_map[tensor];
    }

    ggml_tensor * new_tensor = ggml_dup_tensor(ctx, tensor);
    tensor_map[tensor] = new_tensor;

    new_tensor->op = tensor->op;
    for (int i = 0; i < GGML_MAX_DIMS; i++) {
        new_tensor->nb[i] = tensor->nb[i];
    }
    new_tensor->flags = tensor->flags;
    memcpy(new_tensor->op_params, tensor->op_params, sizeof(tensor->op_params));
    strcpy(new_tensor->name, tensor->name);
    new_tensor->data = tensor->data;
    new_tensor->buffer = tensor->buffer;
    new_tensor->extra = tensor->extra;
    new_tensor->view_offs = tensor->view_offs;
    new_tensor->view_src = map_tensor(tensor_map, ctx, tensor->view_src);
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        new_tensor->src[i] = map_tensor(tensor_map, ctx, tensor->src[i]);
    }

    return new_tensor;
}